

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void bitset_container_set_range(bitset_container_t *bitset,uint32_t begin,uint32_t end)

{
  int iVar1;
  
  bitset_set_range(bitset->words,begin,end);
  iVar1 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar1;
  return;
}

Assistant:

void bitset_container_set_range(bitset_container_t *bitset, uint32_t begin,
                                uint32_t end) {
    bitset_set_range(bitset->words, begin, end);
    bitset->cardinality =
        bitset_container_compute_cardinality(bitset);  // could be smarter
}